

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void cubeb_log_set(cubeb_log_level log_level,cubeb_log_callback log_callback)

{
  cubeb_async_logger *pcVar1;
  
  LOCK();
  g_cubeb_log_level._M_i = log_level;
  UNLOCK();
  if (log_level != CUBEB_LOG_DISABLED && log_callback != (cubeb_log_callback)0x0) {
    LOCK();
    UNLOCK();
    g_cubeb_log_callback._M_b._M_p = (__base_type)(__base_type)log_callback;
    pcVar1 = cubeb_async_logger::get();
    cubeb_async_logger::start(pcVar1);
    return;
  }
  if (log_callback != (cubeb_log_callback)0x0) {
    return;
  }
  LOCK();
  g_cubeb_log_callback._M_b._M_p = (__base_type)cubeb_noop_log_callback;
  UNLOCK();
  pcVar1 = cubeb_async_logger::get();
  cubeb_async_logger::stop(pcVar1);
  return;
}

Assistant:

void
cubeb_log_set(cubeb_log_level log_level, cubeb_log_callback log_callback)
{
  g_cubeb_log_level = log_level;
  // Once a callback has a been set, `g_cubeb_log_callback` is never set back to
  // nullptr, to prevent a TOCTOU race between checking the pointer
  if (log_callback && log_level != CUBEB_LOG_DISABLED) {
    g_cubeb_log_callback = log_callback;
    cubeb_async_logger::get().start();
  } else if (!log_callback || CUBEB_LOG_DISABLED) {
    g_cubeb_log_callback = cubeb_noop_log_callback;
    // This returns once the thread has joined.
    cubeb_async_logger::get().stop();
  } else {
    assert(false && "Incorrect parameters passed to cubeb_log_set");
  }
}